

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O0

Var Js::JavascriptSymbol::TryInvokeRemotelyOrThrow
              (JavascriptMethod entryPoint,ScriptContext *scriptContext,Arguments *args,
              int32 errorCode,PCWSTR varName)

{
  code *pcVar1;
  ScriptContext *pSVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  Var aValue;
  RecyclableObject *pRVar7;
  ThreadContext *this;
  JavascriptLibrary *this_00;
  Arguments local_68;
  JavascriptMethod local_58;
  Var result;
  PCWSTR varName_local;
  Arguments *pAStack_40;
  int32 errorCode_local;
  Arguments *args_local;
  ScriptContext *scriptContext_local;
  JavascriptMethod entryPoint_local;
  Var local_20;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  result = varName;
  varName_local._4_4_ = errorCode;
  pAStack_40 = args;
  args_local = (Arguments *)scriptContext;
  scriptContext_local = (ScriptContext *)entryPoint;
  local_20 = Arguments::operator[](args,0);
  if (local_20 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = TaggedInt::Is(local_20);
  if (bVar3) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar3 = JavascriptNumber::Is_NoTaggedIntCheck(local_20);
    if (bVar3) {
      local_18 = TypeIds_Number;
    }
    else {
      pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_20);
      if (pRStack_10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_14 = RecyclableObject::GetTypeId(pRStack_10);
      if ((0x57 < (int)local_14) && (BVar4 = RecyclableObject::IsExternal(pRStack_10), BVar4 == 0))
      {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_18 = local_14;
    }
  }
  if (local_18 == TypeIds_HostDispatch) {
    aValue = Arguments::operator[](pAStack_40,0);
    pRVar7 = VarTo<Js::RecyclableObject>(aValue);
    pSVar2 = scriptContext_local;
    Arguments::Arguments(&local_68,pAStack_40);
    iVar5 = (*(pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x55])(pRVar7,pSVar2,&local_68,&local_58);
    if (iVar5 != 0) {
      return local_58;
    }
  }
  this = ScriptContext::GetThreadContext((ScriptContext *)args_local);
  bVar3 = ThreadContext::RecordImplicitException(this);
  if (!bVar3) {
    this_00 = ScriptContext::GetLibrary((ScriptContext *)args_local);
    pRVar7 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    return pRVar7;
  }
  JavascriptError::ThrowTypeError((ScriptContext *)args_local,varName_local._4_4_,(PCWSTR)result);
}

Assistant:

Var JavascriptSymbol::TryInvokeRemotelyOrThrow(JavascriptMethod entryPoint, ScriptContext * scriptContext, Arguments & args, int32 errorCode, PCWSTR varName)
    {
        if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
        {
            Var result;
            if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(entryPoint, args, &result))
            {
                return result;
            }
        }
        // Don't error if we disabled implicit calls
        if (scriptContext->GetThreadContext()->RecordImplicitException())
        {
            JavascriptError::ThrowTypeError(scriptContext, errorCode, varName);
        }
        else
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
    }